

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestAdsPerformance::Notifications(TestAdsPerformance *this,size_t numNotifications)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  test_info *ptVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  int local_7c;
  void *local_78;
  string local_70;
  long local_50;
  AdsNotificationAttrib attrib;
  
  lVar5 = AdsPortOpenEx();
  ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
  paVar1 = &local_70.field_2;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar5 != 0,&local_70,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x38f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar7 = 0;
  local_78 = operator_new__(-(ulong)(numNotifications >> 0x3e != 0) | numNotifications * 4);
  attrib.cbLength = 1;
  attrib.nTransMode = 3;
  attrib.nMaxDelay = 0;
  attrib.field_3 = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0xf4240;
  if (numNotifications != 0) {
    do {
      local_7c = 0;
      local_50 = AdsSyncAddDeviceNotificationReqEx
                           (lVar5,&server,0x4020,4,&attrib,NotifyCallback,(uint)uVar7,
                            (uint *)((long)local_78 + uVar7 * 4));
      ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert_eq<int,long>
                ((test_root *)this,&local_7c,&local_50,&local_70,"0",
                 "AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, &notification[hUser])"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x399);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar7 = (ulong)((uint)uVar7 + 1);
    } while (uVar7 < numNotifications);
  }
  local_70._M_dataplus._M_p = (pointer)0x5;
  local_70._M_string_length = 0;
  do {
    iVar4 = nanosleep((timespec *)&local_70,(timespec *)&local_70);
    if (iVar4 != -1) break;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  if (numNotifications != 0) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      local_7c = 0;
      local_50 = AdsSyncDelDeviceNotificationReqEx
                           (lVar5,&server,*(uint *)((long)local_78 + uVar7 * 4));
      ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert_eq<int,long>
                ((test_root *)this,&local_7c,&local_50,&local_70,"0",
                 "AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser])",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x39d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar9 = uVar8 < numNotifications;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9);
  }
  lVar5 = AdsPortCloseEx(lVar5);
  ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar5 == 0,&local_70,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x39f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  operator_delete__(local_78);
  return;
}

Assistant:

void Notifications(size_t numNotifications)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        const auto notification = std::unique_ptr<uint32_t[]>(new uint32_t[numNotifications]);
        AdsNotificationAttrib attrib = { 1, ADSTRANS_SERVERCYCLE, 0, {1000000} };
        uint32_t hUser = 0xDEADBEEF;

        for (hUser = 0; hUser < numNotifications; ++hUser) {
            fructose_assert_eq(0,
                               AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback,
                                                                 hUser,
                                                                 &notification[hUser]));
        }
        std::this_thread::sleep_for(std::chrono::seconds(5));
        for (hUser = 0; hUser < numNotifications; ++hUser) {
            fructose_assert_eq(0, AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser]));
        }
        fructose_assert(0 == AdsPortCloseEx(port));
    }